

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.h
# Opt level: O0

int __thiscall CVmBigNumCacheReg::alloc_mem(CVmBigNumCacheReg *this,size_t siz)

{
  char *pcVar1;
  ulong in_RSI;
  CVmBigNumCacheReg *in_RDI;
  bool bVar2;
  uint local_4;
  
  bVar2 = in_RDI->siz_ < in_RSI;
  if (bVar2) {
    free_mem(in_RDI);
    in_RDI->siz_ = in_RSI + 0x3f & 0xffffffffffffffc0;
    pcVar1 = (char *)malloc(in_RDI->siz_);
    in_RDI->buf_ = pcVar1;
  }
  local_4 = (uint)bVar2;
  return local_4;
}

Assistant:

int alloc_mem(size_t siz)
    {
        /* 
         *   if I'm already at least this large, there's no need to change
         *   anything 
         */
        if (siz_ >= siz)
            return FALSE;

        /* 
         *   round up the size a bit - this will avoid repeatedly
         *   reallocating at slightly different sizes, which could
         *   fragment the heap quite a bit; we'll use a little more memory
         *   than the caller actually asked for, but if they come back and
         *   ask for slightly more next time, an additional allocation
         *   probably won't be necessary, which will save memory in the
         *   long run 
         */
        siz = (siz + 63) & ~63;

        /* delete any existing memory */
        free_mem();
        
        /* remember the new size */
        siz_ = siz;

        /* allocate the memory */
        buf_ = (char *)t3malloc(siz_);

        /* indicate that we allocated memory */
        return TRUE;
    }